

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

void Gia_GlaPrepareCexAndMap(Gla_Man_t *p,Abc_Cex_t **ppCex,Vec_Int_t **pvMap)

{
  Gia_Man_t *p_00;
  int iVar1;
  Vec_Int_t *p_01;
  Gla_Obj_t *pGVar2;
  Gla_Obj_t *pGVar3;
  Abc_Cex_t *pAVar4;
  bool bVar5;
  int local_54;
  int local_50;
  int k;
  int i;
  int f;
  Gia_Obj_t *pGiaObj;
  Gla_Obj_t *pFanin;
  Gla_Obj_t *pObj;
  Vec_Int_t *vMap;
  Abc_Cex_t *pCex;
  Vec_Int_t **pvMap_local;
  Abc_Cex_t **ppCex_local;
  Gla_Man_t *p_local;
  
  p_01 = Vec_IntAlloc(1000);
  local_50 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vAbs);
    if (iVar1 <= local_50) {
      Vec_IntUniqify(p_01);
      iVar1 = Vec_IntSize(p_01);
      pAVar4 = Abc_CexAlloc(0,iVar1,p->pPars->iFrame + 1);
      pAVar4->iFrame = p->pPars->iFrame;
      for (k = 0; k <= p->pPars->iFrame; k = k + 1) {
        local_54 = 0;
        while( true ) {
          iVar1 = Vec_IntSize(p_01);
          bVar5 = false;
          if (local_54 < iVar1) {
            p_00 = p->pGia;
            iVar1 = Vec_IntEntry(p_01,local_54);
            _i = Gia_ManObj(p_00,iVar1);
            bVar5 = _i != (Gia_Obj_t *)0x0;
          }
          if (!bVar5) break;
          iVar1 = Gia_ObjId(p->pGia,_i);
          iVar1 = Gla_ObjSatValue(p,iVar1,k);
          if (iVar1 != 0) {
            iVar1 = Vec_IntSize(p_01);
            Abc_InfoSetBit((uint *)(pAVar4 + 1),k * iVar1 + local_54);
          }
          local_54 = local_54 + 1;
        }
      }
      *pvMap = p_01;
      *ppCex = pAVar4;
      return;
    }
    iVar1 = Vec_IntEntry(p->vAbs,local_50);
    pGVar2 = Gla_ManObj(p,iVar1);
    if ((((*(uint *)&pGVar2->field_0x4 >> 2 & 1) == 0) &&
        ((*(uint *)&pGVar2->field_0x4 >> 5 & 1) == 0)) &&
       ((*(uint *)&pGVar2->field_0x4 >> 7 & 1) == 0)) break;
    for (local_54 = 0; local_54 < (int)(*(uint *)&pGVar2->field_0x4 >> 9); local_54 = local_54 + 1)
    {
      pGVar3 = Gla_ManObj(p,pGVar2->Fanins[local_54]);
      if ((*(uint *)&pGVar3->field_0x4 & 1) == 0) {
        Vec_IntPush(p_01,pGVar3->iGiaObj);
      }
    }
    local_50 = local_50 + 1;
  }
  __assert_fail("pObj->fConst || pObj->fRo || pObj->fAnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                ,0xa0,"void Gia_GlaPrepareCexAndMap(Gla_Man_t *, Abc_Cex_t **, Vec_Int_t **)");
}

Assistant:

void Gia_GlaPrepareCexAndMap( Gla_Man_t * p, Abc_Cex_t ** ppCex, Vec_Int_t ** pvMap )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vMap;
    Gla_Obj_t * pObj, * pFanin;
    Gia_Obj_t * pGiaObj;
    int f, i, k;
    // find PIs and PPIs
    vMap = Vec_IntAlloc( 1000 );
    Gla_ManForEachObjAbs( p, pObj, i )
    {
        assert( pObj->fConst || pObj->fRo || pObj->fAnd );
        Gla_ObjForEachFanin( p, pObj, pFanin, k )
            if ( !pFanin->fAbs )
                Vec_IntPush( vMap, pFanin->iGiaObj );
    }
    Vec_IntUniqify( vMap );
    // derive counter-example
    pCex = Abc_CexAlloc( 0, Vec_IntSize(vMap), p->pPars->iFrame+1 );
    pCex->iFrame = p->pPars->iFrame;
    for ( f = 0; f <= p->pPars->iFrame; f++ )
        Gia_ManForEachObjVec( vMap, p->pGia, pGiaObj, k )
            if ( Gla_ObjSatValue( p, Gia_ObjId(p->pGia, pGiaObj), f ) )
                Abc_InfoSetBit( pCex->pData, f * Vec_IntSize(vMap) + k );
    *pvMap = vMap;
    *ppCex = pCex;
}